

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
TestBody(VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test *this)

{
  FieldDescriptor *this_00;
  KeyValue *pKVar1;
  byte bVar2;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this_01;
  Descriptor *pDVar3;
  long lVar4;
  CppStringType CVar5;
  int iVar6;
  FieldDescriptor *pFVar7;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  RepeatedPtrFieldBase *pRVar9;
  RepeatedPtrField<google::protobuf::Message> *pRVar10;
  Nonnull<const_char_*> pcVar11;
  Descriptor *this_02;
  ExtensionSet *pEVar12;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  bool bVar13;
  Reflection *this_03;
  long lVar14;
  KeyValue *pKVar15;
  _func_int **message;
  KeyValue *pKVar16;
  uint uVar17;
  long lVar18;
  string_view str;
  string_view str_00;
  Metadata MVar19;
  AssertionResult gtest_ar;
  Descriptor *extendee;
  undefined1 local_108 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_100;
  FieldDescriptor *local_f8;
  FieldDescriptor *pFStack_f0;
  FieldDescriptor *local_e8;
  MapFieldBase *pMStack_e0;
  undefined1 local_cd;
  undefined1 auStack_cc [44];
  FieldDescriptor *local_a0;
  MapFieldBase *local_98;
  VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test *local_90;
  uint32_t *local_88;
  ReflectionSchema *local_80;
  long local_78;
  MapDynamicFieldInfo<google::protobuf::Message> local_70;
  DescriptorPool *local_40;
  DescriptorNames local_38;
  
  this_01._M_head_impl = (LogMessageData *)(this->super_VisitFieldsTest).message_;
  auStack_cc._0_4_ = 0xffffffff;
  MVar19 = Message::GetMetadata((Message *)this_01._M_head_impl);
  this_03 = MVar19.reflection;
  if (0 < (this_03->schema_).weak_field_map_offset_) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_00._M_str = "weak fields are not supported";
    str_00._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_108,str_00);
LAB_008fb27e:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_108);
  }
  local_90 = this;
  if ((this_03->schema_).has_bits_offset_ == -1) {
    auStack_cc._4_8_ = (uint32_t *)0x0;
  }
  else {
    auStack_cc._4_8_ = Reflection::GetHasBits(this_03,(Message *)this_01._M_head_impl);
  }
  pDVar3 = this_03->descriptor_;
  local_78 = (long)pDVar3->field_count_;
  if (0 < local_78) {
    local_80 = &this_03->schema_;
    local_88 = (this_03->schema_).has_bit_indices_;
    lVar18 = 0;
    lVar14 = 0;
    do {
      if (lVar14 < pDVar3->field_count_) {
        pcVar11 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar14,(long)pDVar3->field_count_,"index < field_count()");
      }
      if (pcVar11 != (Nonnull<const_char_*>)0x0) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
LAB_008fb1f6:
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
LAB_008fb203:
        protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
      pFVar7 = pDVar3->fields_;
      if (*(char *)(*(long *)((long)&pFVar7->options_ + lVar18) + 0x87) == '\x01') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        str._M_str = "weak fields are not supported";
        str._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)local_108,str);
        goto LAB_008fb27e;
      }
      if ((auStack_cc._0_4_ != 0xffffffff) &&
         (((uint)auStack_cc._0_4_ >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar7->type_)[lVar18] * 4) &
           0x1f) & 1) == 0)) goto LAB_008fade5;
      bVar2 = (&pFVar7->field_0x1)[lVar18];
      bVar13 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar13) {
        pcVar11 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar13,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar11 != (Nonnull<const_char_*>)0x0) goto LAB_008fb1f6;
      this_00 = (FieldDescriptor *)(&pFVar7->super_SymbolBase + lVar18);
      if (((&pFVar7->field_0x1)[lVar18] & 0x20) == 0) {
        bVar13 = ReflectionSchema::InRealOneof(local_80,this_00);
        if (bVar13) {
          lVar4 = *(long *)((long)&pFVar7->scope_ + lVar18);
          if (lVar4 == 0) goto LAB_008fb203;
          if ((ulong)*(uint *)((long)&((this_01._M_head_impl)->entry).full_filename_._M_len +
                              (long)((int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x48)
                                                  ) >> 3) * -0x49249249) * 4 +
                              (ulong)(uint)(this_03->schema_).oneof_case_offset_) !=
              (long)*(int *)((long)&pFVar7->number_ + lVar18)) goto LAB_008fade5;
          switch((&pFVar7->type_)[lVar18]) {
          case '\t':
          case '\f':
            CVar5 = FieldDescriptor::cpp_string_type(this_00);
            if (((CVar5 != kView) && (CVar5 != kString)) && (CVar5 != kCord)) break;
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
          case '\r':
          case '\x0e':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
            Reflection::ClearOneofField(this_03,(Message *)this_01._M_head_impl,this_00);
            break;
          case '\n':
          case '\v':
            goto switchD_008faa5c_caseD_a;
          default:
            goto switchD_008faa5c_default;
          }
        }
        else if (((uint32_t *)auStack_cc._4_8_ == (uint32_t *)0x0) ||
                (uVar17 = local_88[lVar14], uVar17 == 0xffffffff)) {
          bVar13 = Reflection::HasFieldSingular(this_03,(Message *)this_01._M_head_impl,this_00);
          if (bVar13) goto LAB_008fab1e;
        }
        else if ((*(uint *)(auStack_cc._4_8_ + (ulong)(uVar17 >> 5) * 4) >> (uVar17 & 0x1f) & 1) !=
                 0) {
LAB_008fab1e:
          switch((&pFVar7->type_)[lVar18]) {
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
          case '\n':
          case '\v':
          case '\r':
          case '\x0e':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
            break;
          case '\t':
          case '\f':
            CVar5 = FieldDescriptor::cpp_string_type(this_00);
            if (((CVar5 != kView) && (CVar5 != kString)) && (CVar5 != kCord)) goto LAB_008fade5;
            break;
          default:
            goto switchD_008fab3d_default;
          }
switchD_008faa5c_caseD_a:
          Reflection::ClearField(this_03,(Message *)this_01._M_head_impl,this_00);
        }
      }
      else {
        switch((&pFVar7->type_)[lVar18]) {
        case '\x01':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double> *)
                       local_108);
          }
          break;
        case '\x02':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float> *)
                       local_108);
          }
          break;
        case '\x03':
        case '\x10':
        case '\x12':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long> *)
                       local_108);
          }
          break;
        case '\x04':
        case '\x06':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                        *)local_108);
          }
          break;
        case '\x05':
        case '\x0e':
        case '\x0f':
        case '\x11':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int> *)
                       local_108);
          }
          break;
        case '\a':
        case '\r':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                        *)local_108);
          }
          break;
        case '\b':
          pFVar7 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                             (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = SooRep::size((SooRep *)pFVar7,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar7->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar6 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_01._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar7;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool> *)
                       local_108);
          }
          break;
        case '\t':
        case '\f':
          CVar5 = FieldDescriptor::cpp_string_type(this_00);
          if ((CVar5 - kView < 3) &&
             (pRVar8 = Reflection::
                       GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                 (this_03,(Message *)this_01._M_head_impl,this_00),
             (pRVar8->super_RepeatedPtrFieldBase).current_size_ != 0)) {
            pRVar9 = (RepeatedPtrFieldBase *)
                     Reflection::MutableRawRepeatedString
                               (this_03,(Message *)this_01._M_head_impl,this_00,true);
            RepeatedPtrFieldBase::
            Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar9);
          }
          break;
        case '\n':
LAB_008facb7:
          pRVar10 = Reflection::
                    GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (this_03,(Message *)this_01._M_head_impl,this_00);
          if ((pRVar10->super_RepeatedPtrFieldBase).current_size_ != 0) {
            pRVar9 = (RepeatedPtrFieldBase *)
                     Reflection::MutableRawRepeatedField
                               (this_03,(Message *)this_01._M_head_impl,this_00,CPPTYPE_MESSAGE,-1,
                                (Descriptor *)0x0);
            RepeatedPtrFieldBase::
            Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pRVar9)
            ;
          }
          break;
        case '\v':
          bVar13 = FieldDescriptor::is_map_message_type(this_00);
          if (!bVar13) goto LAB_008facb7;
          local_98 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                               (this_03,(Message *)this_01._M_head_impl,this_00);
          iVar6 = MapFieldBase::size(local_98);
          if (iVar6 != 0) {
            this_02 = FieldDescriptor::message_type(this_00);
            local_a0 = Descriptor::map_key(this_02);
            pFVar7 = Descriptor::map_value(this_02);
            MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (&local_70,this_03,(Message *)this_01._M_head_impl,this_00,local_a0,pFVar7,
                       local_98);
            local_e8 = local_70.value;
            pMStack_e0 = local_70.const_map_field;
            local_f8 = local_70.field;
            pFStack_f0 = local_70.key;
            local_108 = (undefined1  [8])local_70.reflection;
            _Stack_100._M_head_impl = (LogMessageData *)local_70.message;
            MapDynamicFieldInfo<google::protobuf::Message>::Clear
                      ((MapDynamicFieldInfo<google::protobuf::Message> *)local_108);
          }
          break;
        default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
switchD_008fab3d_default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
switchD_008faa5c_default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_cc + 0xc));
          if (local_70.reflection != (Reflection *)0x0) {
            (**(code **)&(local_70.reflection)->descriptor_->field_count_)();
          }
          local_70.reflection = (Reflection *)0x0;
          if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&_Stack_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Stack_100._M_head_impl);
          }
          _Unwind_Resume(extraout_RAX);
        }
      }
LAB_008fade5:
      lVar14 = lVar14 + 1;
      lVar18 = lVar18 + 0x58;
    } while (local_78 != lVar14);
  }
  if ((this_03->schema_).extensions_offset_ != -1) {
    pEVar12 = Reflection::MutableExtensionSet(this_03,(Message *)this_01._M_head_impl);
    local_38.payload_ = (char *)this_03->descriptor_;
    auStack_cc._36_8_ = &local_38;
    local_40 = this_03->descriptor_pool_;
    auStack_cc._28_8_ = &local_40;
    auStack_cc._12_8_ = auStack_cc;
    auStack_cc._20_8_ = &local_cd;
    lVar14 = (long)(short)pEVar12->flat_size_;
    pKVar15 = (pEVar12->map_).flat;
    if (lVar14 < 0) {
      internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
    }
    else {
      lVar18 = lVar14 * 0x20;
      pKVar1 = pKVar15 + lVar14;
      pKVar16 = pKVar15;
      local_108 = (undefined1  [8])auStack_cc._12_8_;
      _Stack_100._M_head_impl = (LogMessageData *)auStack_cc._20_8_;
      local_f8 = (FieldDescriptor *)auStack_cc._28_8_;
      pFStack_f0 = (FieldDescriptor *)auStack_cc._36_8_;
      if (pEVar12->flat_size_ != 0) {
        uVar17 = 0;
        do {
          lVar18 = lVar18 + -0x20;
          ExtensionSet::Extension::PrefetchPtr(&pKVar16->second);
          pKVar16 = pKVar16 + 1;
          if (lVar18 == 0) break;
          bVar13 = uVar17 < 0xf;
          uVar17 = uVar17 + 1;
        } while (bVar13);
      }
      if (pKVar16 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar15->first,&pKVar15->second);
          ExtensionSet::Extension::PrefetchPtr(&pKVar16->second);
          pKVar15 = pKVar15 + 1;
          pKVar16 = pKVar16 + 1;
        } while (pKVar16 != pKVar1);
      }
      if (pKVar15 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar15->first,&pKVar15->second);
          pKVar15 = pKVar15 + 1;
        } while (pKVar15 != pKVar1);
      }
    }
  }
  iVar6 = (*(((local_90->super_VisitFieldsTest).message_)->super_MessageLite)._vptr_MessageLite[3])
                    ();
  local_70.reflection = (Reflection *)CONCAT44(extraout_var,iVar6);
  auStack_cc._12_8_ = auStack_cc._12_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"message_->ByteSizeLong()","0",(unsigned_long *)&local_70,
             (int *)(auStack_cc + 0xc));
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (_Stack_100._M_head_impl == (LogMessageData *)0x0) {
      message = (_func_int **)(anon_var_dwarf_a12c75 + 5);
    }
    else {
      message = (_func_int **)((_Stack_100._M_head_impl)->entry).full_filename_._M_len;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(auStack_cc + 0xc),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0x7f,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(auStack_cc + 0xc),(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_cc + 0xc));
    if (local_70.reflection != (Reflection *)0x0) {
      (**(code **)&(local_70.reflection)->descriptor_->field_count_)();
    }
  }
  if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_100._M_head_impl);
  }
  return;
}

Assistant:

TEST_P(VisitFieldsTest, ClearByVisitFieldsMustBeEmpty) {
  VisitFields(*message_, [](auto info) { info.Clear(); });

  EXPECT_EQ(message_->ByteSizeLong(), 0);
}